

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

TextureCubemap * LoadTextureCubemap(TextureCubemap *__return_storage_ptr__,Image image,int layout)

{
  undefined1 auVar1 [16];
  float fVar2;
  void *__ptr;
  TextureCubemap *pTVar3;
  uint uVar4;
  long lVar5;
  float *pfVar6;
  int i;
  int size;
  int width;
  float fVar7;
  Rectangle srcRec;
  float fStack_dc;
  undefined8 local_d8;
  float afStack_d0 [2];
  undefined8 local_c8;
  undefined8 uStack_c0;
  ulong local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Image local_78;
  TextureCubemap *local_60;
  float local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->id = 0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->mipmaps = 0;
  width = 0;
  if (layout == 0) {
    layout = 4;
    if (image.height < image.width) {
      if (image.width / 6 == image.height) {
        layout = 2;
        width = image.height;
      }
      else {
        width = image.width / 4;
        if (width != image.height / 3) {
          if (image.width < (int)((float)image.height * 1.85)) goto LAB_001398b8;
          layout = 5;
        }
      }
    }
    else {
      if (image.height <= image.width) {
LAB_001398b8:
        TraceLog(4,"IMAGE: Failed to detect cubemap image layout");
        return __return_storage_ptr__;
      }
      if (image.height / 6 == image.width) {
        layout = 1;
        width = image.width;
      }
      else {
        layout = 3;
        width = image.width / 3;
        if (width != image.height / 4) goto LAB_001398b8;
      }
    }
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = width;
  }
  local_78.mipmaps = 0;
  local_78.format = 0;
  local_78.data = (void *)0x0;
  local_78.width = 0;
  local_78.height = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  afStack_d0[0] = 0.0;
  afStack_d0[1] = 0.0;
  local_48 = (float)width;
  for (lVar5 = 0xc; lVar5 != 0x6c; lVar5 = lVar5 + 0x10) {
    *(undefined8 *)(&stack0xffffffffffffff1c + lVar5) = 0;
    *(float *)((long)&fStack_dc + lVar5) = local_48;
    *(float *)((long)&local_d8 + lVar5) = local_48;
  }
  local_58 = local_48;
  switch(layout) {
  case 1:
    local_78.mipmaps = (int)image._16_8_;
    local_78.format = SUB84(image._16_8_,4);
    local_78.data = image.data;
    local_78.width = (int)image._8_8_;
    local_78.height = SUB84(image._8_8_,4);
    pfVar6 = (float *)((long)&local_d8 + 4);
    for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
      *pfVar6 = (float)(int)lVar5 * local_48;
      pfVar6 = pfVar6 + 4;
    }
    goto switchD_001396a7_caseD_5;
  case 2:
    pfVar6 = (float *)&local_d8;
    for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
      *pfVar6 = (float)(int)lVar5 * local_48;
      pfVar6 = pfVar6 + 4;
    }
    break;
  case 3:
    local_c8 = CONCAT44(local_48 * 3.0,local_48);
    fVar7 = local_48 + local_48;
    local_98._0_4_ = 0.0;
    fVar2 = local_48;
    goto LAB_001397a7;
  case 4:
    local_c8 = (ulong)(uint)local_48 << 0x20;
    fVar7 = local_48 * 3.0;
    fVar2 = local_48 + local_48;
    local_98._0_4_ = local_48;
LAB_001397a7:
    local_a8 = CONCAT44(local_48 + local_48,local_48);
    local_98 = CONCAT44(local_48,(float)local_98);
    local_b8 = (ulong)(uint)local_48;
    local_d8 = CONCAT44(local_48,fVar2);
    local_88 = CONCAT44(local_48,fVar7);
    break;
  case 5:
    goto switchD_001396a7_caseD_5;
  }
  GenImageColor(&local_78,width,width * 6,(Color)0xffff00ff);
  ImageFormat(&local_78,image.format);
  local_48 = local_58;
switchD_001396a7_caseD_5:
  local_60 = __return_storage_ptr__;
  fStack_44 = local_48;
  fStack_40 = local_48;
  fStack_3c = local_48;
  pfVar6 = afStack_d0;
  for (lVar5 = 0; __ptr = local_78.data, lVar5 != 6; lVar5 = lVar5 + 1) {
    auVar1._8_4_ = fStack_44;
    auVar1._4_4_ = local_48;
    srcRec.width = pfVar6[0];
    srcRec.height = pfVar6[1];
    srcRec.x = pfVar6[-2];
    srcRec.y = pfVar6[-1];
    auVar1._0_4_ = (float)(int)lVar5 * local_58;
    auVar1._12_4_ = 0;
    ImageDraw(&local_78,image,srcRec,(Rectangle)(auVar1 << 0x20),(Color)0xffffffff);
    pfVar6 = pfVar6 + 4;
  }
  uVar4 = rlLoadTextureCubemap(local_78.data,width,local_78.format);
  pTVar3 = local_60;
  local_60->id = uVar4;
  if (uVar4 == 0) {
    TraceLog(4,"IMAGE: Failed to load cubemap image");
  }
  free(__ptr);
  return pTVar3;
}

Assistant:

TextureCubemap LoadTextureCubemap(Image image, int layout)
{
    TextureCubemap cubemap = { 0 };

    if (layout == CUBEMAP_LAYOUT_AUTO_DETECT)      // Try to automatically guess layout type
    {
        // Check image width/height to determine the type of cubemap provided
        if (image.width > image.height)
        {
            if ((image.width/6) == image.height) { layout = CUBEMAP_LAYOUT_LINE_HORIZONTAL; cubemap.width = image.width/6; }
            else if ((image.width/4) == (image.height/3)) { layout = CUBEMAP_LAYOUT_CROSS_FOUR_BY_THREE; cubemap.width = image.width/4; }
            else if (image.width >= (int)((float)image.height*1.85f)) { layout = CUBEMAP_LAYOUT_PANORAMA; cubemap.width = image.width/4; }
        }
        else if (image.height > image.width)
        {
            if ((image.height/6) == image.width) { layout = CUBEMAP_LAYOUT_LINE_VERTICAL; cubemap.width = image.height/6; }
            else if ((image.width/3) == (image.height/4)) { layout = CUBEMAP_LAYOUT_CROSS_THREE_BY_FOUR; cubemap.width = image.width/3; }
        }

        cubemap.height = cubemap.width;
    }

    if (layout != CUBEMAP_LAYOUT_AUTO_DETECT)
    {
        int size = cubemap.width;

        Image faces = { 0 };                // Vertical column image
        Rectangle faceRecs[6] = { 0 };      // Face source rectangles
        for (int i = 0; i < 6; i++) faceRecs[i] = (Rectangle){ 0, 0, (float)size, (float)size };

        if (layout == CUBEMAP_LAYOUT_LINE_VERTICAL)
        {
            faces = image;
            for (int i = 0; i < 6; i++) faceRecs[i].y = (float)size*i;
        }
        else if (layout == CUBEMAP_LAYOUT_PANORAMA)
        {
            // TODO: Convert panorama image to square faces...
            // Ref: https://github.com/denivip/panorama/blob/master/panorama.cpp
        }
        else
        {
            if (layout == CUBEMAP_LAYOUT_LINE_HORIZONTAL) for (int i = 0; i < 6; i++) faceRecs[i].x = (float)size*i;
            else if (layout == CUBEMAP_LAYOUT_CROSS_THREE_BY_FOUR)
            {
                faceRecs[0].x = (float)size; faceRecs[0].y = (float)size;
                faceRecs[1].x = (float)size; faceRecs[1].y = (float)size*3;
                faceRecs[2].x = (float)size; faceRecs[2].y = 0;
                faceRecs[3].x = (float)size; faceRecs[3].y = (float)size*2;
                faceRecs[4].x = 0; faceRecs[4].y = (float)size;
                faceRecs[5].x = (float)size*2; faceRecs[5].y = (float)size;
            }
            else if (layout == CUBEMAP_LAYOUT_CROSS_FOUR_BY_THREE)
            {
                faceRecs[0].x = (float)size*2; faceRecs[0].y = (float)size;
                faceRecs[1].x = 0; faceRecs[1].y = (float)size;
                faceRecs[2].x = (float)size; faceRecs[2].y = 0;
                faceRecs[3].x = (float)size; faceRecs[3].y = (float)size*2;
                faceRecs[4].x = (float)size; faceRecs[4].y = (float)size;
                faceRecs[5].x = (float)size*3; faceRecs[5].y = (float)size;
            }

            // Convert image data to 6 faces in a vertical column, that's the optimum layout for loading
            faces = GenImageColor(size, size*6, MAGENTA);
            ImageFormat(&faces, image.format);

            // TODO: Image formating does not work with compressed textures!
        }

        for (int i = 0; i < 6; i++) ImageDraw(&faces, image, faceRecs[i], (Rectangle){ 0, (float)size*i, (float)size, (float)size }, WHITE);

        cubemap.id = rlLoadTextureCubemap(faces.data, size, faces.format);
        if (cubemap.id == 0) TRACELOG(LOG_WARNING, "IMAGE: Failed to load cubemap image");

        UnloadImage(faces);
    }
    else TRACELOG(LOG_WARNING, "IMAGE: Failed to detect cubemap image layout");

    return cubemap;
}